

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

Type * __thiscall
soul::HEARTGenerator::getArrayOrVectorType
          (Type *__return_storage_ptr__,HEARTGenerator *this,ArrayElementRef *a)

{
  bool bVar1;
  Expression *pEVar2;
  CompileMessage local_70;
  undefined1 local_21;
  ArrayElementRef *local_20;
  ArrayElementRef *a_local;
  HEARTGenerator *this_local;
  Type *arrayOrVectorType;
  
  local_21 = 0;
  local_20 = a;
  a_local = (ArrayElementRef *)this;
  this_local = (HEARTGenerator *)__return_storage_ptr__;
  pEVar2 = pool_ptr<soul::AST::Expression>::operator->(&a->object);
  (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[4])(__return_storage_ptr__);
  bVar1 = Type::isArrayOrVector(__return_storage_ptr__);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  pEVar2 = pool_ptr<soul::AST::Expression>::operator->(&local_20->object);
  Errors::expectedArrayOrVectorForBracketOp<>();
  AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_70,false);
}

Assistant:

Type getArrayOrVectorType (AST::ArrayElementRef& a)
    {
        auto arrayOrVectorType = a.object->getResultType();

        if (! arrayOrVectorType.isArrayOrVector())
            a.object->context.throwError (Errors::expectedArrayOrVectorForBracketOp());

        return arrayOrVectorType;
    }